

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::warnIfPossible(QPDFObjectHandle *this,string *warning)

{
  undefined8 qpdf;
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  element_type *this_01;
  Pipeline *this_02;
  shared_ptr<QPDFLogger> local_118;
  QPDFLogger local_108;
  allocator<char> local_f1;
  string local_f0;
  QPDFExc local_d0;
  undefined1 local_40 [8];
  string description;
  QPDF *context;
  string *warning_local;
  QPDFObjectHandle *this_local;
  
  description.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    bVar1 = QPDFObject::getDescription
                      (this_00,(QPDF **)((long)&description.field_2 + 8),(string *)local_40);
    qpdf = description.field_2._8_8_;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
      QPDFExc::QPDFExc(&local_d0,qpdf_e_damaged_pdf,&local_f0,(string *)local_40,0,warning);
      warn((QPDF *)qpdf,&local_d0);
      QPDFExc::~QPDFExc(&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      goto LAB_002c7259;
    }
  }
  QPDFLogger::defaultLogger();
  peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_118);
  QPDFLogger::getError(&local_108,SUB81(peVar2,0));
  this_01 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                      ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &local_108);
  this_02 = Pipeline::operator<<(this_01,warning);
  Pipeline::operator<<(this_02,"\n");
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_108);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_118);
LAB_002c7259:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void
QPDFObjectHandle::warnIfPossible(std::string const& warning) const
{
    QPDF* context = nullptr;
    std::string description;
    if (obj && obj->getDescription(context, description)) {
        warn(context, QPDFExc(qpdf_e_damaged_pdf, "", description, 0, warning));
    } else {
        *QPDFLogger::defaultLogger()->getError() << warning << "\n";
    }
}